

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O2

void __thiscall WasmCGen::Call(WasmCGen *this)

{
  uint uVar1;
  pointer pwVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  string call;
  string local_50;
  
  printf("/*%s*/\n","Call");
  uVar1 = (((this->super_w3SourceGen).super_Wasm.instr)->super_w3DecodedInstructionZeroInit).field_0
          .u32;
  uVar3 = (ulong)uVar1;
  pwVar2 = (this->module->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)(((long)(this->module->functions).
                             super__Vector_base<w3Function,_std::allocator<w3Function>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pwVar2) / 0x28)) {
    pwVar2[uVar3].function_index = uVar3;
    sVar4 = pwVar2[uVar3].param_count;
    StringFormat_abi_cxx11_(&call,"function%d(",(ulong)uVar1);
    while( true ) {
      bVar5 = sVar4 == 0;
      sVar4 = sVar4 - 1;
      if (bVar5) break;
      if (sVar4 != 0) {
        std::__cxx11::string::append((char *)&call);
      }
      w3SourceGenStack::pop_abi_cxx11_(&local_50,&(this->super_w3SourceGen).stack);
      std::__cxx11::string::append((string *)&call);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::append((char *)&call);
    w3SourceGen::push(&this->super_w3SourceGen,&call);
    std::__cxx11::string::~string((string *)&call);
    return;
  }
  AssertFailed("function_index < module->functions.size ()");
}

Assistant:

CGEN (Call)
{
    printf ("/*%s*/\n", __func__);

    // FIXME In the instruction table
    const size_t function_index = instr->u32;
    Assert (function_index < module->functions.size ());
    w3Function* function = &module->functions [function_index];
    function->function_index = function_index; // TODO remove this

    size_t param_count = function->param_count;

    string call = StringFormat("function%d(", (int)function_index);

    // todo of course this might be backwards

    for (size_t i = 0; i < param_count; ++i)
    {
        if (i != param_count - 1)
            call += ",";
        call += pop ();
    }
    call += ")";
    push (call);
}